

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ListColumnReader::ReadInternal<duckdb::TemplatedListSkipper>
          (ListColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          optional_ptr<duckdb::Vector,_true> result_out)

{
  Vector *this_00;
  int iVar1;
  idx_t repdef_idx;
  pointer pCVar2;
  undefined4 extraout_var;
  idx_t count;
  ulong uVar3;
  idx_t offset;
  idx_t count_00;
  bool bVar4;
  idx_t iVar5;
  undefined4 extraout_var_00;
  
  this_00 = &this->read_vector;
  bVar4 = false;
  iVar5 = 0;
  do {
    if (bVar4) {
      return iVar5;
    }
    count = this->overflow_child_count;
    if (count == 0) {
      switchD_014c69ad::default
                ((this->child_defines).super_ByteBuffer.ptr,0,
                 (this->child_defines).super_ByteBuffer.len);
      switchD_014c69ad::default
                ((this->child_repeats).super_ByteBuffer.ptr,0,
                 (this->child_repeats).super_ByteBuffer.len);
      pCVar2 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(&this->child_column_reader);
      iVar1 = (*pCVar2->_vptr_ColumnReader[9])(pCVar2);
      uVar3 = CONCAT44(extraout_var,iVar1);
      if (0x7ff < uVar3) {
        uVar3 = 0x800;
      }
      Vector::ResetFromCache(this_00,&this->read_cache);
      pCVar2 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(&this->child_column_reader);
      iVar1 = (*pCVar2->_vptr_ColumnReader[3])
                        (pCVar2,uVar3,this->child_defines_ptr,this->child_repeats_ptr,this_00);
      count = CONCAT44(extraout_var_00,iVar1);
      if (count == 0) {
        return iVar5;
      }
    }
    else {
      this->overflow_child_count = 0;
    }
    Vector::Verify(this_00,count);
    offset = 0;
    while( true ) {
      count_00 = count - offset;
      bVar4 = count_00 != 0;
      if (count_00 == 0) break;
      if (((this->super_ColumnReader).column_schema)->max_repeat !=
          (ulong)this->child_repeats_ptr[offset]) {
        if (num_values <= iVar5) {
          if (iVar5 == num_values) {
            Vector::Slice(this_00,this_00,offset,count);
            this->overflow_child_count = count_00;
            Vector::Verify(this_00,count_00);
            for (uVar3 = 0; iVar5 = num_values, uVar3 < this->overflow_child_count;
                uVar3 = uVar3 + 1) {
              this->child_defines_ptr[uVar3] = this->child_defines_ptr[offset];
              this->child_repeats_ptr[uVar3] = this->child_repeats_ptr[offset];
              offset = offset + 1;
            }
          }
          break;
        }
        if (repeat_out != (data_ptr_t)0x0) {
          repeat_out[iVar5] = this->child_repeats_ptr[offset];
        }
        if (define_out != (data_ptr_t)0x0) {
          define_out[iVar5] = this->child_defines_ptr[offset];
        }
        iVar5 = iVar5 + 1;
      }
      offset = offset + 1;
    }
  } while( true );
}

Assistant:

idx_t ListColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out,
                                     optional_ptr<Vector> result_out) {
	idx_t result_offset = 0;
	auto data = OP::Initialize(result_out);

	// if an individual list is longer than STANDARD_VECTOR_SIZE we actually have to loop the child read to fill it
	bool finished = false;
	while (!finished) {
		idx_t child_actual_num_values = 0;

		// check if we have any overflow from a previous read
		if (overflow_child_count == 0) {
			// we don't: read elements from the child reader
			child_defines.zero();
			child_repeats.zero();
			// we don't know in advance how many values to read because of the beautiful repetition/definition setup
			// we just read (up to) a vector from the child column, and see if we have read enough
			// if we have not read enough, we read another vector
			// if we have read enough, we leave any unhandled elements in the overflow vector for a subsequent read
			auto child_req_num_values =
			    MinValue<idx_t>(STANDARD_VECTOR_SIZE, child_column_reader->GroupRowsAvailable());
			read_vector.ResetFromCache(read_cache);
			child_actual_num_values =
			    child_column_reader->Read(child_req_num_values, child_defines_ptr, child_repeats_ptr, read_vector);
		} else {
			// we do: use the overflow values
			child_actual_num_values = overflow_child_count;
			overflow_child_count = 0;
		}

		if (child_actual_num_values == 0) {
			// no more elements available: we are done
			break;
		}
		read_vector.Verify(child_actual_num_values);
		idx_t current_chunk_offset = OP::GetOffset(result_out);

		// hard-won piece of code this, modify at your own risk
		// the intuition is that we have to only collapse values into lists that are repeated *on this level*
		// the rest is pretty much handed up as-is as a single-valued list or NULL
		idx_t child_idx;
		for (child_idx = 0; child_idx < child_actual_num_values; child_idx++) {
			if (child_repeats_ptr[child_idx] == MaxRepeat()) {
				// value repeats on this level, append
				D_ASSERT(result_offset > 0);
				OP::HandleRepeat(data, result_offset - 1);
				continue;
			}

			if (result_offset >= num_values) {
				// we ran out of output space
				finished = true;
				break;
			}
			if (child_defines_ptr[child_idx] >= MaxDefine()) {
				// value has been defined down the stack, hence its NOT NULL
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 1);
			} else if (child_defines_ptr[child_idx] == MaxDefine() - 1) {
				// empty list
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 0);
			} else {
				// value is NULL somewhere up the stack
				OP::HandleNull(data, result_offset);
			}

			if (repeat_out) {
				repeat_out[result_offset] = child_repeats_ptr[child_idx];
			}
			if (define_out) {
				define_out[result_offset] = child_defines_ptr[child_idx];
			}

			result_offset++;
		}
		// actually append the required elements to the child list
		OP::AppendVector(result_out, read_vector, child_idx);

		// we have read more values from the child reader than we can fit into the result for this read
		// we have to pass everything from child_idx to child_actual_num_values into the next call
		if (child_idx < child_actual_num_values && result_offset == num_values) {
			read_vector.Slice(read_vector, child_idx, child_actual_num_values);
			overflow_child_count = child_actual_num_values - child_idx;
			read_vector.Verify(overflow_child_count);

			// move values in the child repeats and defines *backward* by child_idx
			for (idx_t repdef_idx = 0; repdef_idx < overflow_child_count; repdef_idx++) {
				child_defines_ptr[repdef_idx] = child_defines_ptr[child_idx + repdef_idx];
				child_repeats_ptr[repdef_idx] = child_repeats_ptr[child_idx + repdef_idx];
			}
		}
	}
	return result_offset;
}